

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zzz_monster_test.h
# Opt level: O1

int zzz_MyGame_Example_Alt_verify_table(flatcc_table_verifier_descriptor_t *td)

{
  int iVar1;
  
  iVar1 = flatcc_verify_table_field(td,0,0,zzz_MyGame_Example_TestJSONPrefix_verify_table);
  if (iVar1 == 0) {
    iVar1 = flatcc_verify_table_field(td,1,0,zzz_Fantasy_Movie_verify_table);
    if (iVar1 == 0) {
      iVar1 = flatcc_verify_union_vector_field(td,3,0,zzz_MyGame_Example_Any_union_verifier);
      if (iVar1 == 0) {
        iVar1 = flatcc_verify_table_vector_field
                          (td,4,0,zzz_MyGame_Example_MultipleKeys_verify_table);
        if (iVar1 == 0) {
          iVar1 = flatcc_verify_vector_field(td,5,0,8,4,0x1fffffff);
          if (iVar1 == 0) {
            iVar1 = flatcc_verify_string_vector_field(td,6,0);
            if (iVar1 == 0) {
              iVar1 = flatcc_verify_vector_field(td,7,0,4,4,0x3fffffff);
              if (iVar1 == 0) {
                iVar1 = flatcc_verify_field(td,8,0x7c,4);
                return iVar1;
              }
            }
          }
        }
      }
    }
  }
  return iVar1;
}

Assistant:

static int zzz_MyGame_Example_Alt_verify_table(flatcc_table_verifier_descriptor_t *td)
{
    int ret;
    if ((ret = flatcc_verify_table_field(td, 0, 0, &zzz_MyGame_Example_TestJSONPrefix_verify_table) /* prefix */)) return ret;
    if ((ret = flatcc_verify_table_field(td, 1, 0, &zzz_Fantasy_Movie_verify_table) /* movie */)) return ret;
    if ((ret = flatcc_verify_union_vector_field(td, 3, 0, &zzz_MyGame_Example_Any_union_verifier) /* manyany */)) return ret;
    if ((ret = flatcc_verify_table_vector_field(td, 4, 0, &zzz_MyGame_Example_MultipleKeys_verify_table) /* multik */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 5, 0, 8, 4, INT64_C(536870911)) /* rapunzels */)) return ret;
    if ((ret = flatcc_verify_string_vector_field(td, 6, 0) /* names */)) return ret;
    if ((ret = flatcc_verify_vector_field(td, 7, 0, 4, 4, INT64_C(1073741823)) /* samples */)) return ret;
    if ((ret = flatcc_verify_field(td, 8, 124, 4) /* fixed_array */)) return ret;
    return flatcc_verify_ok;
}